

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_haiku.c
# Opt level: O0

void select_button(Token *button)

{
  Token *in_RDI;
  float unaff_retaddr;
  int unaff_retaddr_00;
  Sprite *spr;
  float in_stack_ffffffffffffffec;
  Sprite *pSVar1;
  Token *pTVar2;
  
  if (in_RDI != selected_button) {
    pTVar2 = in_RDI;
    if (selected_button != (Token *)0x0) {
      pSVar1 = &selected_button->top;
      anim_to((Sprite *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(float *)in_RDI,
              (float)((ulong)pSVar1 >> 0x20),(Interp)pSVar1,in_stack_ffffffffffffffec);
      anim_to((Sprite *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(float *)in_RDI,
              (float)((ulong)pSVar1 >> 0x20),(Interp)pSVar1,in_stack_ffffffffffffffec);
      anim_to((Sprite *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(float *)in_RDI,
              (float)((ulong)pSVar1 >> 0x20),(Interp)pSVar1,in_stack_ffffffffffffffec);
      pSVar1 = &selected_button->bot;
      anim_to((Sprite *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(float *)in_RDI,
              (float)((ulong)pSVar1 >> 0x20),(Interp)pSVar1,in_stack_ffffffffffffffec);
      anim_to((Sprite *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(float *)in_RDI,
              (float)((ulong)pSVar1 >> 0x20),(Interp)pSVar1,in_stack_ffffffffffffffec);
      pTVar2 = in_RDI;
    }
    selected_button = pTVar2;
    pSVar1 = &selected_button->top;
    pTVar2 = selected_button;
    anim_to((Sprite *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(float *)selected_button,
            (float)((ulong)pSVar1 >> 0x20),(Interp)pSVar1,in_stack_ffffffffffffffec);
    anim_to((Sprite *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(float *)pTVar2,
            (float)((ulong)pSVar1 >> 0x20),(Interp)pSVar1,in_stack_ffffffffffffffec);
    anim_to((Sprite *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(float *)pTVar2,
            (float)((ulong)pSVar1 >> 0x20),(Interp)pSVar1,in_stack_ffffffffffffffec);
    pSVar1 = &pTVar2->bot;
    anim_to((Sprite *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(float *)pTVar2,
            (float)((ulong)pSVar1 >> 0x20),(Interp)pSVar1,in_stack_ffffffffffffffec);
    anim_to((Sprite *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(float *)pTVar2,
            (float)((ulong)pSVar1 >> 0x20),(Interp)pSVar1,in_stack_ffffffffffffffec);
    change_healthy_glow(unaff_retaddr_00,unaff_retaddr);
    al_play_sample(0x3f800000,0,select_sample,0x100,0);
  }
  return;
}

Assistant:

static void select_button(Token *button)
{
   Sprite *spr;

   if (button == selected_button)
      return;

   if (selected_button) {
      spr = &selected_button->top;
      anim_to(spr, &spr->scale_x, button_unsel_scale, INTERP_SLOW, 0.3);
      anim_to(spr, &spr->scale_y, button_unsel_scale, INTERP_SLOW, 0.3);
      anim_to(spr, &spr->opacity, 0.5, INTERP_DOUBLE_SLOW, 0.2);

      spr = &selected_button->bot;
      anim_to(spr, &spr->scale_x, dropshadow_unsel_scale, INTERP_SLOW, 0.3);
      anim_to(spr, &spr->scale_y, dropshadow_unsel_scale, INTERP_SLOW, 0.3);
   }

   selected_button = button;

   spr = &button->top;
   anim_to(spr, &spr->scale_x, button_sel_scale, INTERP_FAST, 0.3);
   anim_to(spr, &spr->scale_y, button_sel_scale, INTERP_FAST, 0.3);
   anim_to(spr, &spr->opacity, 1.0, INTERP_FAST, 0.3);

   spr = &button->bot;
   anim_to(spr, &spr->scale_x, dropshadow_sel_scale, INTERP_FAST, 0.3);
   anim_to(spr, &spr->scale_y, dropshadow_sel_scale, INTERP_FAST, 0.3);

   change_healthy_glow(button->type, button->x);

   al_play_sample(select_sample, 1.0, 0.0, 1.0, ALLEGRO_PLAYMODE_ONCE, NULL);
}